

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringNewCodePoint(TranslateToFuzzReader *this)

{
  StringNew *pSVar1;
  Type local_20;
  Expression *local_18;
  Expression *codePoint;
  TranslateToFuzzReader *this_local;
  
  codePoint = (Expression *)this;
  Type::Type(&local_20,i32);
  local_18 = make(this,local_20);
  pSVar1 = Builder::makeStringNew
                     (&this->builder,StringNewFromCodePoint,local_18,(Expression *)0x0,
                      (Expression *)0x0);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringNewCodePoint() {
  auto codePoint = make(Type::i32);
  return builder.makeStringNew(StringNewFromCodePoint, codePoint);
}